

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O0

void re2::RE2Replace(void)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  LogMessage local_850;
  LogMessage local_6d0;
  StringPiece local_550;
  RE2 local_540;
  allocator local_459;
  string local_458 [8];
  string all;
  LogMessage local_438;
  LogMessage local_2b8;
  StringPiece local_138;
  RE2 local_128;
  allocator local_31;
  string local_30 [8];
  string one;
  ReplaceTest *local_10;
  ReplaceTest *t;
  
  for (local_10 = RE2Replace::tests; local_10->original != (char *)0x0; local_10 = local_10 + 1) {
    pcVar2 = local_10->original;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_30,pcVar2,&local_31);
    std::allocator<char>::~allocator((allocator<char> *)&local_31);
    RE2::RE2(&local_128,local_10->regexp);
    StringPiece::StringPiece(&local_138,local_10->rewrite);
    bVar3 = RE2::Replace((string *)local_30,&local_128,&local_138);
    RE2::~RE2(&local_128);
    if (!bVar3) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_2b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb4);
      poVar5 = LogMessage::stream(&local_2b8);
      std::operator<<(poVar5,"Check failed: RE2::Replace(&one, t->regexp, t->rewrite)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_2b8);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_30,local_10->single);
    if (!bVar3) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_438,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb5);
      poVar5 = LogMessage::stream(&local_438);
      std::operator<<(poVar5,"Check failed: (one) == (t->single)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_438);
    }
    pcVar2 = local_10->original;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_458,pcVar2,&local_459);
    std::allocator<char>::~allocator((allocator<char> *)&local_459);
    RE2::RE2(&local_540,local_10->regexp);
    StringPiece::StringPiece(&local_550,local_10->rewrite);
    iVar4 = RE2::GlobalReplace((string *)local_458,&local_540,&local_550);
    iVar1 = local_10->greplace_count;
    RE2::~RE2(&local_540);
    if (iVar4 != iVar1) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_6d0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb7);
      poVar5 = LogMessage::stream(&local_6d0);
      poVar5 = std::operator<<(poVar5,
                               "Check failed: (RE2::GlobalReplace(&all, t->regexp, t->rewrite)) == (t->greplace_count)"
                              );
      poVar5 = std::operator<<(poVar5,"Got: ");
      std::operator<<(poVar5,local_458);
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_6d0);
    }
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_458,local_10->global);
    if (!bVar3) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_850,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
                 ,0xb9);
      poVar5 = LogMessage::stream(&local_850);
      std::operator<<(poVar5,"Check failed: (all) == (t->global)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_850);
    }
    std::__cxx11::string::~string(local_458);
    std::__cxx11::string::~string(local_30);
  }
  return;
}

Assistant:

TEST(RE2, Replace) {
  VLOG(1) << "TestReplace";

  struct ReplaceTest {
    const char *regexp;
    const char *rewrite;
    const char *original;
    const char *single;
    const char *global;
    int        greplace_count;
  };
  static const ReplaceTest tests[] = {
    { "(qu|[b-df-hj-np-tv-z]*)([a-z]+)",
      "\\2\\1ay",
      "the quick brown fox jumps over the lazy dogs.",
      "ethay quick brown fox jumps over the lazy dogs.",
      "ethay ickquay ownbray oxfay umpsjay overay ethay azylay ogsday.",
      9 },
    { "\\w+",
      "\\0-NOSPAM",
      "abcd.efghi@google.com",
      "abcd-NOSPAM.efghi@google.com",
      "abcd-NOSPAM.efghi-NOSPAM@google-NOSPAM.com-NOSPAM",
      4 },
    { "^",
      "(START)",
      "foo",
      "(START)foo",
      "(START)foo",
      1 },
    { "^",
      "(START)",
      "",
      "(START)",
      "(START)",
      1 },
    { "$",
      "(END)",
      "",
      "(END)",
      "(END)",
      1 },
    { "b",
      "bb",
      "ababababab",
      "abbabababab",
      "abbabbabbabbabb",
      5 },
    { "b",
      "bb",
      "bbbbbb",
      "bbbbbbb",
      "bbbbbbbbbbbb",
      6 },
    { "b+",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "bbbbbb",
      "bb",
      "bb",
      1 },
    { "b*",
      "bb",
      "aaaaa",
      "bbaaaaa",
      "bbabbabbabbabbabb",
      6 },
    // Check newline handling
    { "a.*a",
      "(\\0)",
      "aba\naba",
      "(aba)\naba",
      "(aba)\n(aba)",
      2 },
    { "", NULL, NULL, NULL, NULL, 0 }
  };

  for (const ReplaceTest* t = tests; t->original != NULL; t++) {
    VLOG(1) << StringPrintf("\"%s\" =~ s/%s/%s/g", t->original, t->regexp, t->rewrite);
    string one(t->original);
    CHECK(RE2::Replace(&one, t->regexp, t->rewrite));
    CHECK_EQ(one, t->single);
    string all(t->original);
    CHECK_EQ(RE2::GlobalReplace(&all, t->regexp, t->rewrite), t->greplace_count)
      << "Got: " << all;
    CHECK_EQ(all, t->global);
  }
}